

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O0

QByteArray * operator+=(QByteArray *a,DecodedData<const_QString_&> *b)

{
  long lVar1;
  DecodedData<const_QString_&> *s;
  qsizetype qVar2;
  DecodedData<const_QString_&> *s_00;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype len;
  char *it;
  QByteArray *in_stack_ffffffffffffffc0;
  QByteArray *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = (DecodedData<const_QString_&> *)QByteArray::size(in_RDI);
  qVar2 = QConcatenable<QStringEncoder::DecodedData<const_QString_&>_>::size(s);
  QByteArray::reserve(in_stack_ffffffffffffffc0,(long)&s->encoder + qVar2);
  s_00 = (DecodedData<const_QString_&> *)QByteArray::data((QByteArray *)s);
  qVar2 = QByteArray::size(in_RDI);
  this = (QByteArray *)((long)&s_00->encoder + qVar2);
  QConcatenable<QStringEncoder::DecodedData<const_QString_&>_>::appendTo(s_00,(char **)s);
  QByteArray::constData((QByteArray *)0x7b89a9);
  QByteArray::resize(this,(qsizetype)s_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &operator+=(QByteArray &a, const QStringEncoder::DecodedData<T> &b)
{
    qsizetype len = a.size() + QConcatenable<QStringEncoder::DecodedData<T>>::size(b);
    a.reserve(len);
    char *it = a.data() + a.size();
    QConcatenable<QStringEncoder::DecodedData<T>>::appendTo(b, it);
    a.resize(qsizetype(it - a.constData())); //may be smaller than len
    return a;
}